

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

int __thiscall smf::MidiFile::getTrackCountAsType1(MidiFile *this)

{
  int iVar1;
  MidiEvent *pMVar2;
  int i;
  int anIndex;
  int iVar3;
  
  if (this->m_theTrackState == 1) {
    iVar3 = 0;
    anIndex = 0;
    while( true ) {
      iVar1 = MidiEventList::size(*(this->m_events).
                                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      if (iVar1 <= anIndex) break;
      pMVar2 = getEvent(this,0,anIndex);
      if (iVar3 < pMVar2->track) {
        pMVar2 = getEvent(this,0,anIndex);
        iVar3 = pMVar2->track;
      }
      anIndex = anIndex + 1;
    }
    iVar3 = iVar3 + 1;
  }
  else {
    iVar3 = (int)((ulong)((long)(this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return iVar3;
}

Assistant:

int MidiFile::getTrackCountAsType1(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		int output = 0;
		int i;
		for (i=0; i<(int)m_events[0]->size(); i++) {
			if (getEvent(0,i).track > output) {
				output = getEvent(0,i).track;
			}
		}
		return output+1;  // I think the track values are 0 offset...
	} else {
		return (int)m_events.size();
	}
}